

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragIntRange2
               (char *label,int *v_current_min,int *v_current_max,float v_speed,int v_min,int v_max,
               char *format,char *format_max,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  int v_min_00;
  ImGuiWindow *pIVar4;
  char *text_end;
  uint uVar5;
  float w_full;
  char *local_98;
  int local_7c;
  int local_74;
  int local_70;
  ImGuiSliderFlags max_flags;
  int max_max;
  int max_min;
  bool value_changed;
  ImGuiSliderFlags min_flags;
  int min_max;
  int min_min;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *format_local;
  int v_max_local;
  int v_min_local;
  float v_speed_local;
  int *v_current_max_local;
  int *v_current_min_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    PushID(label);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    if (v_min < v_max) {
      local_74 = ImMin<int>(v_max,*v_current_max);
      local_70 = v_min;
    }
    else {
      local_70 = -0x80000000;
      local_74 = *v_current_max;
    }
    uVar5 = 0;
    if (local_70 == local_74) {
      uVar5 = 0x200000;
    }
    bVar2 = DragInt("##min",v_current_min,v_speed,local_70,local_74,format,flags | uVar5);
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    if (v_min < v_max) {
      v_min_00 = ImMax<int>(v_min,*v_current_min);
      local_7c = v_max;
    }
    else {
      v_min_00 = *v_current_min;
      local_7c = 0x7fffffff;
    }
    uVar5 = 0;
    if (v_min_00 == local_7c) {
      uVar5 = 0x200000;
    }
    local_98 = format;
    if (format_max != (char *)0x0) {
      local_98 = format_max;
    }
    bVar3 = DragInt("##max",v_current_max,v_speed,v_min_00,local_7c,local_98,flags | uVar5);
    label_local._7_1_ = bVar2 || bVar3;
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragIntRange2(const char* label, int* v_current_min, int* v_current_max, float v_speed, int v_min, int v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    int min_min = (v_min >= v_max) ? INT_MIN : v_min;
    int min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragInt("##min", v_current_min, v_speed, min_min, min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    int max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    int max_max = (v_min >= v_max) ? INT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragInt("##max", v_current_max, v_speed, max_min, max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}